

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O0

void highbd_dr_prediction_32bit_z2_HxW_avx2
               (int H,int W,uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,
               int upsample_above,int upsample_left,int dx,int dy)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  uint uVar34;
  int iVar35;
  undefined8 *puVar36;
  long in_RCX;
  long in_RDX;
  int in_ESI;
  int in_EDI;
  long in_R8;
  long in_R9;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  __m256i mask256;
  __m256i base_y_c256;
  __m256i y_c_1_256;
  __m256i y_c256;
  __m256i c256;
  int base_shift8;
  int base_min_diff;
  int base_shift;
  int base_x;
  int y;
  int j;
  __m256i r6;
  __m256i j256;
  __m256i resxy;
  __m256i resy [2];
  __m256i resx [2];
  __m256i ydx;
  __m256i shift;
  __m256i res;
  __m256i b;
  int r;
  int base_y_c [16];
  __m128i a1_1_x128;
  __m128i a0_1_x128;
  __m128i a1_x128;
  __m128i a0_x128;
  __m256i c8;
  __m256i c0123;
  __m256i c1234;
  __m256i dy256;
  __m256i c3f;
  __m256i min_base_y256;
  __m256i diff;
  __m256i c1;
  __m256i a16;
  __m256i a1_1_x;
  __m256i a0_1_x;
  __m256i a32;
  __m256i a1_y;
  __m256i a0_y;
  __m256i a1_x;
  __m256i a0_x;
  int frac_bits_y;
  int frac_bits_x;
  int min_base_y;
  int min_base_x;
  int local_1918;
  int local_1914;
  int local_1910;
  uint local_1904;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined1 local_18a0 [32];
  undefined1 local_1860 [32];
  undefined1 local_1840 [16];
  int local_1784;
  int local_1780;
  int iStack_177c;
  int iStack_1778;
  int iStack_1774;
  int iStack_1770;
  int iStack_176c;
  int iStack_1768;
  int iStack_1764;
  int local_1760;
  int iStack_175c;
  int iStack_1758;
  int iStack_1754;
  int iStack_1750;
  int iStack_174c;
  int iStack_1748;
  int iStack_1744;
  long local_14d0;
  ulong uStack_14b8;
  ulong uStack_1498;
  ulong uStack_1478;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  
  auVar1 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar1 = vpinsrd_avx(auVar1,0x10,2);
  auVar1 = vpinsrd_avx(auVar1,0x10,3);
  auVar2 = vpinsrd_avx(ZEXT416(0x10),0x10,1);
  auVar2 = vpinsrd_avx(auVar2,0x10,2);
  auVar2 = vpinsrd_avx(auVar2,0x10,3);
  uStack_1010 = auVar2._0_8_;
  uStack_1008 = auVar2._8_8_;
  auVar10._16_8_ = uStack_1010;
  auVar10._0_16_ = auVar1;
  auVar10._24_8_ = uStack_1008;
  auVar10 = vpsrld_avx2(auVar10,ZEXT416(4));
  auVar11._16_8_ = uStack_1010;
  auVar11._0_16_ = auVar1;
  auVar11._24_8_ = uStack_1008;
  auVar11 = vpsrld_avx2(auVar11,ZEXT416(1));
  auVar2 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
  auVar2 = vpinsrd_avx(auVar2,0xffffffff,2);
  auVar2 = vpinsrd_avx(auVar2,0xffffffff,3);
  auVar3 = vpinsrd_avx(ZEXT416(0xffffffff),0xffffffff,1);
  auVar3 = vpinsrd_avx(auVar3,0xffffffff,2);
  auVar3 = vpinsrd_avx(auVar3,0xffffffff,3);
  uStack_fd0 = auVar3._0_8_;
  uStack_fc8 = auVar3._8_8_;
  auVar3 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
  auVar3 = vpinsrd_avx(auVar3,0x3f,2);
  auVar3 = vpinsrd_avx(auVar3,0x3f,3);
  auVar4 = vpinsrd_avx(ZEXT416(0x3f),0x3f,1);
  auVar4 = vpinsrd_avx(auVar4,0x3f,2);
  auVar4 = vpinsrd_avx(auVar4,0x3f,3);
  uStack_f90 = auVar4._0_8_;
  uStack_f88 = auVar4._8_8_;
  auVar4 = vpinsrd_avx(ZEXT416((uint)dx),dx,1);
  auVar4 = vpinsrd_avx(auVar4,dx,2);
  auVar4 = vpinsrd_avx(auVar4,dx,3);
  auVar39 = vpinsrd_avx(ZEXT416((uint)dx),dx,1);
  auVar39 = vpinsrd_avx(auVar39,dx,2);
  auVar39 = vpinsrd_avx(auVar39,dx,3);
  uStack_f50 = auVar39._0_8_;
  uStack_f48 = auVar39._8_8_;
  auVar39 = vpinsrd_avx(ZEXT416(4),5,1);
  auVar39 = vpinsrd_avx(auVar39,6,2);
  auVar39 = vpinsrd_avx(auVar39,7,3);
  auVar37 = vpinsrd_avx(ZEXT416(0),1,1);
  auVar37 = vpinsrd_avx(auVar37,2,2);
  auVar37 = vpinsrd_avx(auVar37,3,3);
  auVar37 = ZEXT116(0) * auVar39 + ZEXT116(1) * auVar37;
  auVar39 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar39;
  uStack_2d0 = auVar39._0_8_;
  uStack_2c8 = auVar39._8_8_;
  auVar7._16_8_ = uStack_2d0;
  auVar7._0_16_ = auVar37;
  auVar7._24_8_ = uStack_2c8;
  auVar10 = vpaddd_avx2(auVar7,auVar10);
  local_14d0 = in_RDX;
  for (local_1784 = 0; local_1784 < in_EDI; local_1784 = local_1784 + 1) {
    for (local_1904 = 0; (int)local_1904 < in_ESI; local_1904 = local_1904 + 0x10) {
      auVar39 = vpinsrd_avx(ZEXT416(local_1904),local_1904,1);
      auVar39 = vpinsrd_avx(auVar39,local_1904,2);
      auVar39 = vpinsrd_avx(auVar39,local_1904,3);
      auVar40 = vpinsrd_avx(ZEXT416(local_1904),local_1904,1);
      auVar40 = vpinsrd_avx(auVar40,local_1904,2);
      auVar40 = vpinsrd_avx(auVar40,local_1904,3);
      uStack_f10 = auVar40._0_8_;
      uStack_f08 = auVar40._8_8_;
      uVar34 = (local_1784 + 1) * upsample_left;
      auVar40 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
      auVar40 = vpinsrd_avx(auVar40,uVar34,2);
      auVar40 = vpinsrd_avx(auVar40,uVar34,3);
      auVar38 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
      auVar38 = vpinsrd_avx(auVar38,uVar34,2);
      auVar38 = vpinsrd_avx(auVar38,uVar34,3);
      auVar38 = ZEXT116(0) * auVar40 + ZEXT116(1) * auVar38;
      auVar40 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar40;
      uStack_ed0 = auVar40._0_8_;
      uStack_ec8 = auVar40._8_8_;
      iVar35 = (int)(local_1904 * 0x40 - (local_1784 + 1) * upsample_left) >> 6;
      local_1910 = 0;
      if (iVar35 < -2) {
        local_1910 = -2 - iVar35;
      }
      local_1914 = -1 - iVar35;
      if (local_1914 < 0x11) {
        if (local_1914 < 0) {
          local_1914 = 0;
        }
      }
      else {
        local_1914 = 0x10;
      }
      if (local_1910 < 8) {
        auVar40 = vpshufb_avx(*(undefined1 (*) [16])
                               (in_R8 + (long)iVar35 * 2 + (long)local_1910 * 2),
                              (undefined1  [16])HighbdLoadMaskx[local_1910]);
        auVar5 = vpshufb_avx(*(undefined1 (*) [16])
                              (in_R8 + (long)iVar35 * 2 + 2 + (long)local_1910 * 2),
                             (undefined1  [16])HighbdLoadMaskx[local_1910]);
        auVar8 = vpmovzxwd_avx2(auVar40);
        auVar9 = vpmovzxwd_avx2(auVar5);
        auVar26._16_8_ = uStack_2d0;
        auVar26._0_16_ = auVar37;
        auVar26._24_8_ = uStack_2c8;
        auVar25._16_8_ = uStack_f10;
        auVar25._0_16_ = auVar39;
        auVar25._24_8_ = uStack_f08;
        auVar7 = vpaddd_avx2(auVar26,auVar25);
        auVar7 = vpslld_avx2(auVar7,ZEXT416(6));
        auVar13._16_8_ = uStack_ed0;
        auVar13._0_16_ = auVar38;
        auVar13._24_8_ = uStack_ec8;
        auVar7 = vpsubd_avx2(auVar7,auVar13);
        auVar12._16_8_ = uStack_f90;
        auVar12._0_16_ = auVar3;
        auVar12._24_8_ = uStack_f88;
        auVar7 = vpand_avx2(auVar7,auVar12);
        auVar12 = vpsrld_avx2(auVar7,ZEXT416(1));
        auVar9 = vpsubd_avx2(auVar9,auVar8);
        auVar7 = vpslld_avx2(auVar8,ZEXT416(5));
        auVar8._16_8_ = uStack_1010;
        auVar8._0_16_ = auVar1;
        auVar8._24_8_ = uStack_1008;
        auVar7 = vpaddd_avx2(auVar7,auVar8);
        auVar8 = vpmulld_avx2(auVar9,auVar12);
        auVar7 = vpaddd_avx2(auVar7,auVar8);
        auVar7 = vpsrld_avx2(auVar7,ZEXT416(5));
        local_1860 = vpackusdw_avx2(auVar7,ZEXT1632(auVar7._16_16_));
      }
      else {
        uStack_1478 = SUB328(ZEXT832(0),4);
        local_1860 = ZEXT832(uStack_1478) << 0x40;
      }
      local_1918 = 0;
      if (iVar35 + 8 < -2) {
        local_1918 = -2 - (iVar35 + 8);
      }
      if (local_1918 < 8) {
        auVar40 = vpshufb_avx(*(undefined1 (*) [16])
                               (in_R8 + (long)iVar35 * 2 + 0x10 + (long)local_1918 * 2),
                              (undefined1  [16])HighbdLoadMaskx[local_1918]);
        auVar5 = vpshufb_avx(*(undefined1 (*) [16])
                              (in_R8 + (long)iVar35 * 2 + 0x12 + (long)local_1918 * 2),
                             (undefined1  [16])HighbdLoadMaskx[local_1918]);
        auVar8 = vpmovzxwd_avx2(auVar40);
        auVar9 = vpmovzxwd_avx2(auVar5);
        auVar24._16_8_ = uStack_f10;
        auVar24._0_16_ = auVar39;
        auVar24._24_8_ = uStack_f08;
        auVar7 = vpaddd_avx2(auVar24,auVar11);
        auVar23._16_8_ = uStack_2d0;
        auVar23._0_16_ = auVar37;
        auVar23._24_8_ = uStack_2c8;
        auVar7 = vpaddd_avx2(auVar23,auVar7);
        auVar7 = vpslld_avx2(auVar7,ZEXT416(6));
        auVar18._16_8_ = uStack_ed0;
        auVar18._0_16_ = auVar38;
        auVar18._24_8_ = uStack_ec8;
        auVar7 = vpsubd_avx2(auVar7,auVar18);
        auVar16._16_8_ = uStack_f90;
        auVar16._0_16_ = auVar3;
        auVar16._24_8_ = uStack_f88;
        auVar7 = vpand_avx2(auVar7,auVar16);
        auVar12 = vpsrld_avx2(auVar7,ZEXT416(1));
        auVar9 = vpsubd_avx2(auVar9,auVar8);
        auVar7 = vpslld_avx2(auVar8,ZEXT416(5));
        auVar22._16_8_ = uStack_1010;
        auVar22._0_16_ = auVar1;
        auVar22._24_8_ = uStack_1008;
        auVar7 = vpaddd_avx2(auVar7,auVar22);
        auVar8 = vpmulld_avx2(auVar9,auVar12);
        auVar7 = vpaddd_avx2(auVar7,auVar8);
        auVar7 = vpsrld_avx2(auVar7,ZEXT416(5));
        auVar7 = vpackusdw_avx2(auVar7,ZEXT1632(auVar7._16_16_));
        local_1840 = auVar7._0_16_;
      }
      else {
        uStack_1498 = SUB328(ZEXT832(0),4);
        local_1840._8_8_ = 0;
        local_1840._0_8_ = uStack_1498;
        local_1840 = local_1840 << 0x40;
      }
      auVar40 = local_1860._0_16_;
      auVar38 = ZEXT116(0) * local_1860._16_16_ + ZEXT116(1) * local_1840;
      uStack_14b8 = SUB328(ZEXT832(0),4);
      local_18a0 = ZEXT832(uStack_14b8) << 0x40;
      if (iVar35 < -1) {
        uVar34 = local_1784 << 6;
        auVar5 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
        auVar5 = vpinsrd_avx(auVar5,uVar34,2);
        auVar5 = vpinsrd_avx(auVar5,uVar34,3);
        auVar6 = vpinsrd_avx(ZEXT416(uVar34),uVar34,1);
        auVar6 = vpinsrd_avx(auVar6,uVar34,2);
        auVar6 = vpinsrd_avx(auVar6,uVar34,3);
        uStack_e90 = auVar6._0_8_;
        uStack_e88 = auVar6._8_8_;
        auVar21._16_8_ = uStack_f10;
        auVar21._0_16_ = auVar39;
        auVar21._24_8_ = uStack_f08;
        auVar7 = vpaddd_avx2(auVar21,auVar10);
        auVar28._16_8_ = uStack_f50;
        auVar28._0_16_ = auVar4;
        auVar28._24_8_ = uStack_f48;
        auVar8 = vpmulld_avx2(auVar7,auVar28);
        auVar17._16_8_ = uStack_e90;
        auVar17._0_16_ = auVar5;
        auVar17._24_8_ = uStack_e88;
        auVar12 = vpsubd_avx2(auVar17,auVar8);
        auVar9 = vpsrad_avx2(auVar12,ZEXT416(6));
        auVar33._16_8_ = uStack_fd0;
        auVar33._0_16_ = auVar2;
        auVar33._24_8_ = uStack_fc8;
        auVar8 = vpcmpgtd_avx2(auVar33,auVar9);
        auVar8 = vpandn_avx2(auVar8,auVar9);
        iStack_177c = auVar8._4_4_;
        local_1780 = auVar8._0_4_;
        iStack_1774 = auVar8._12_4_;
        iStack_1778 = auVar8._8_4_;
        iStack_176c = auVar8._20_4_;
        iStack_1770 = auVar8._16_4_;
        iStack_1764 = auVar8._28_4_;
        iStack_1768 = auVar8._24_4_;
        auVar7 = vpaddd_avx2(auVar7,auVar11);
        auVar27._16_8_ = uStack_f50;
        auVar27._0_16_ = auVar4;
        auVar27._24_8_ = uStack_f48;
        auVar7 = vpmulld_avx2(auVar7,auVar27);
        auVar9._16_8_ = uStack_e90;
        auVar9._0_16_ = auVar5;
        auVar9._24_8_ = uStack_e88;
        auVar13 = vpsubd_avx2(auVar9,auVar7);
        auVar8 = vpsrad_avx2(auVar13,ZEXT416(6));
        auVar32._16_8_ = uStack_fd0;
        auVar32._0_16_ = auVar2;
        auVar32._24_8_ = uStack_fc8;
        auVar7 = vpcmpgtd_avx2(auVar32,auVar8);
        auVar7 = vpandn_avx2(auVar7,auVar8);
        iStack_175c = auVar7._4_4_;
        local_1760 = auVar7._0_4_;
        iStack_1754 = auVar7._12_4_;
        iStack_1758 = auVar7._8_4_;
        iStack_174c = auVar7._20_4_;
        iStack_1750 = auVar7._16_4_;
        iStack_1744 = auVar7._28_4_;
        iStack_1748 = auVar7._24_4_;
        auVar39 = vpinsrw_avx(ZEXT216(*(ushort *)(in_R9 + (long)local_1780 * 2)),
                              (uint)*(ushort *)(in_R9 + (long)iStack_177c * 2),1);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_1778 * 2),2);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_1774 * 2),3);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_1770 * 2),4);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_176c * 2),5);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_1768 * 2),6);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_1764 * 2),7);
        auVar8 = vpmovzxwd_avx2(auVar39);
        auVar39 = vpinsrw_avx(ZEXT216(*(ushort *)(in_R9 + 2 + (long)local_1780 * 2)),
                              (uint)*(ushort *)(in_R9 + 2 + (long)iStack_177c * 2),1);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_1778 * 2),2);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_1774 * 2),3);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_1770 * 2),4);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_176c * 2),5);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_1768 * 2),6);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_1764 * 2),7);
        auVar9 = vpmovzxwd_avx2(auVar39);
        auVar15._16_8_ = uStack_f90;
        auVar15._0_16_ = auVar3;
        auVar15._24_8_ = uStack_f88;
        auVar7 = vpand_avx2(auVar12,auVar15);
        auVar12 = vpsrld_avx2(auVar7,ZEXT416(1));
        auVar9 = vpsubd_avx2(auVar9,auVar8);
        auVar7 = vpslld_avx2(auVar8,ZEXT416(5));
        auVar20._16_8_ = uStack_1010;
        auVar20._0_16_ = auVar1;
        auVar20._24_8_ = uStack_1008;
        auVar7 = vpaddd_avx2(auVar7,auVar20);
        auVar8 = vpmulld_avx2(auVar9,auVar12);
        auVar7 = vpaddd_avx2(auVar7,auVar8);
        auVar7 = vpsrld_avx2(auVar7,ZEXT416(5));
        auVar31._16_16_ = ZEXT416(5);
        auVar31._0_16_ = auVar7._16_16_;
        auVar7 = vpackusdw_avx2(auVar7,auVar31);
        auVar39 = vpinsrw_avx(ZEXT216(*(ushort *)(in_R9 + (long)local_1760 * 2)),
                              (uint)*(ushort *)(in_R9 + (long)iStack_175c * 2),1);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_1758 * 2),2);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_1754 * 2),3);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_1750 * 2),4);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_174c * 2),5);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_1748 * 2),6);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + (long)iStack_1744 * 2),7);
        auVar9 = vpmovzxwd_avx2(auVar39);
        auVar39 = vpinsrw_avx(ZEXT216(*(ushort *)(in_R9 + 2 + (long)local_1760 * 2)),
                              (uint)*(ushort *)(in_R9 + 2 + (long)iStack_175c * 2),1);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_1758 * 2),2);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_1754 * 2),3);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_1750 * 2),4);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_174c * 2),5);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_1748 * 2),6);
        auVar39 = vpinsrw_avx(auVar39,(uint)*(ushort *)(in_R9 + 2 + (long)iStack_1744 * 2),7);
        auVar12 = vpmovzxwd_avx2(auVar39);
        auVar14._16_8_ = uStack_f90;
        auVar14._0_16_ = auVar3;
        auVar14._24_8_ = uStack_f88;
        auVar8 = vpand_avx2(auVar13,auVar14);
        auVar13 = vpsrld_avx2(auVar8,ZEXT416(1));
        auVar12 = vpsubd_avx2(auVar12,auVar9);
        auVar8 = vpslld_avx2(auVar9,ZEXT416(5));
        auVar19._16_8_ = uStack_1010;
        auVar19._0_16_ = auVar1;
        auVar19._24_8_ = uStack_1008;
        auVar8 = vpaddd_avx2(auVar8,auVar19);
        auVar9 = vpmulld_avx2(auVar12,auVar13);
        auVar8 = vpaddd_avx2(auVar8,auVar9);
        auVar8 = vpsrld_avx2(auVar8,ZEXT416(5));
        auVar30._16_16_ = ZEXT416(5);
        auVar30._0_16_ = auVar8._16_16_;
        auVar8 = vpackusdw_avx2(auVar8,auVar30);
        local_18a0._0_16_ = ZEXT116(0) * auVar8._0_16_ + ZEXT116(1) * auVar7._0_16_;
        local_18a0._16_16_ = ZEXT116(0) * auVar7._16_16_ + ZEXT116(1) * auVar8._0_16_;
      }
      local_1860._16_8_ = auVar38._0_8_;
      local_1860._24_8_ = auVar38._8_8_;
      auVar29._16_8_ = local_1860._16_8_;
      auVar29._0_16_ = ZEXT116(0) * local_1840 + ZEXT116(1) * auVar40;
      auVar29._24_8_ = local_1860._24_8_;
      auVar7 = vpblendvb_avx2(auVar29,local_18a0,(undefined1  [32])HighbdBaseMask[local_1914]);
      puVar36 = (undefined8 *)(local_14d0 + (long)(int)local_1904 * 2);
      local_18c0 = auVar7._0_8_;
      uStack_18b8 = auVar7._8_8_;
      uStack_18b0 = auVar7._16_8_;
      uStack_18a8 = auVar7._24_8_;
      *puVar36 = local_18c0;
      puVar36[1] = uStack_18b8;
      puVar36[2] = uStack_18b0;
      puVar36[3] = uStack_18a8;
    }
    local_14d0 = in_RCX * 2 + local_14d0;
  }
  return;
}

Assistant:

static void highbd_dr_prediction_32bit_z2_HxW_avx2(
    int H, int W, uint16_t *dst, ptrdiff_t stride, const uint16_t *above,
    const uint16_t *left, int upsample_above, int upsample_left, int dx,
    int dy) {
  // here upsample_above and upsample_left are 0 by design of
  // av1_use_intra_edge_upsample
  const int min_base_x = -1;
  const int min_base_y = -1;
  (void)upsample_above;
  (void)upsample_left;
  const int frac_bits_x = 6;
  const int frac_bits_y = 6;

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m256i a0_x, a1_x, a0_y, a1_y, a32, a0_1_x, a1_1_x, a16, c1;
  __m256i diff, min_base_y256, c3f, dy256, c1234, c0123, c8;
  __m128i a0_x128, a1_x128, a0_1_x128, a1_1_x128;
  DECLARE_ALIGNED(32, int, base_y_c[16]);

  a16 = _mm256_set1_epi32(16);
  c1 = _mm256_srli_epi32(a16, 4);
  c8 = _mm256_srli_epi32(a16, 1);
  min_base_y256 = _mm256_set1_epi32(min_base_y);
  c3f = _mm256_set1_epi32(0x3f);
  dy256 = _mm256_set1_epi32(dy);
  c0123 = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
  c1234 = _mm256_add_epi32(c0123, c1);

  for (int r = 0; r < H; r++) {
    __m256i b, res, shift, ydx;
    __m256i resx[2], resy[2];
    __m256i resxy, j256, r6;
    for (int j = 0; j < W; j += 16) {
      j256 = _mm256_set1_epi32(j);
      int y = r + 1;
      ydx = _mm256_set1_epi32(y * dx);

      int base_x = ((j << 6) - y * dx) >> frac_bits_x;
      int base_shift = 0;
      if ((base_x) < (min_base_x - 1)) {
        base_shift = (min_base_x - base_x - 1);
      }
      int base_min_diff = (min_base_x - base_x);
      if (base_min_diff > 16) {
        base_min_diff = 16;
      } else {
        if (base_min_diff < 0) base_min_diff = 0;
      }

      if (base_shift > 7) {
        resx[0] = _mm256_setzero_si256();
      } else {
        a0_x128 = _mm_loadu_si128((__m128i *)(above + base_x + base_shift));
        a1_x128 = _mm_loadu_si128((__m128i *)(above + base_x + base_shift + 1));
        a0_x128 =
            _mm_shuffle_epi8(a0_x128, *(__m128i *)HighbdLoadMaskx[base_shift]);
        a1_x128 =
            _mm_shuffle_epi8(a1_x128, *(__m128i *)HighbdLoadMaskx[base_shift]);

        a0_x = _mm256_cvtepu16_epi32(a0_x128);
        a1_x = _mm256_cvtepu16_epi32(a1_x128);

        r6 = _mm256_slli_epi32(_mm256_add_epi32(c0123, j256), 6);
        shift = _mm256_srli_epi32(
            _mm256_and_si256(_mm256_sub_epi32(r6, ydx), c3f), 1);

        diff = _mm256_sub_epi32(a1_x, a0_x);  // a[x+1] - a[x]
        a32 = _mm256_slli_epi32(a0_x, 5);     // a[x] * 32
        a32 = _mm256_add_epi32(a32, a16);     // a[x] * 32 + 16

        b = _mm256_mullo_epi32(diff, shift);
        res = _mm256_add_epi32(a32, b);
        res = _mm256_srli_epi32(res, 5);

        resx[0] = _mm256_packus_epi32(
            res, _mm256_castsi128_si256(_mm256_extracti128_si256(res, 1)));
      }
      int base_shift8 = 0;
      if ((base_x + 8) < (min_base_x - 1)) {
        base_shift8 = (min_base_x - (base_x + 8) - 1);
      }
      if (base_shift8 > 7) {
        resx[1] = _mm256_setzero_si256();
      } else {
        a0_1_x128 =
            _mm_loadu_si128((__m128i *)(above + base_x + base_shift8 + 8));
        a1_1_x128 =
            _mm_loadu_si128((__m128i *)(above + base_x + base_shift8 + 9));
        a0_1_x128 = _mm_shuffle_epi8(a0_1_x128,
                                     *(__m128i *)HighbdLoadMaskx[base_shift8]);
        a1_1_x128 = _mm_shuffle_epi8(a1_1_x128,
                                     *(__m128i *)HighbdLoadMaskx[base_shift8]);

        a0_1_x = _mm256_cvtepu16_epi32(a0_1_x128);
        a1_1_x = _mm256_cvtepu16_epi32(a1_1_x128);

        r6 = _mm256_slli_epi32(
            _mm256_add_epi32(c0123, _mm256_add_epi32(j256, c8)), 6);
        shift = _mm256_srli_epi32(
            _mm256_and_si256(_mm256_sub_epi32(r6, ydx), c3f), 1);

        diff = _mm256_sub_epi32(a1_1_x, a0_1_x);  // a[x+1] - a[x]
        a32 = _mm256_slli_epi32(a0_1_x, 5);       // a[x] * 32
        a32 = _mm256_add_epi32(a32, a16);         // a[x] * 32 + 16
        b = _mm256_mullo_epi32(diff, shift);

        resx[1] = _mm256_add_epi32(a32, b);
        resx[1] = _mm256_srli_epi32(resx[1], 5);
        resx[1] = _mm256_packus_epi32(
            resx[1],
            _mm256_castsi128_si256(_mm256_extracti128_si256(resx[1], 1)));
      }
      resx[0] =
          _mm256_inserti128_si256(resx[0], _mm256_castsi256_si128(resx[1]),
                                  1);  // 16 16bit values

      // y calc
      resy[0] = _mm256_setzero_si256();
      if ((base_x < min_base_x)) {
        __m256i c256, y_c256, y_c_1_256, base_y_c256, mask256;
        r6 = _mm256_set1_epi32(r << 6);
        c256 = _mm256_add_epi32(j256, c1234);
        y_c256 = _mm256_sub_epi32(r6, _mm256_mullo_epi32(c256, dy256));
        base_y_c256 = _mm256_srai_epi32(y_c256, frac_bits_y);
        mask256 = _mm256_cmpgt_epi32(min_base_y256, base_y_c256);
        base_y_c256 = _mm256_andnot_si256(mask256, base_y_c256);
        _mm256_store_si256((__m256i *)base_y_c, base_y_c256);
        c256 = _mm256_add_epi32(c256, c8);
        y_c_1_256 = _mm256_sub_epi32(r6, _mm256_mullo_epi32(c256, dy256));
        base_y_c256 = _mm256_srai_epi32(y_c_1_256, frac_bits_y);
        mask256 = _mm256_cmpgt_epi32(min_base_y256, base_y_c256);
        base_y_c256 = _mm256_andnot_si256(mask256, base_y_c256);
        _mm256_store_si256((__m256i *)(base_y_c + 8), base_y_c256);

        a0_y = _mm256_cvtepu16_epi32(_mm_setr_epi16(
            left[base_y_c[0]], left[base_y_c[1]], left[base_y_c[2]],
            left[base_y_c[3]], left[base_y_c[4]], left[base_y_c[5]],
            left[base_y_c[6]], left[base_y_c[7]]));
        a1_y = _mm256_cvtepu16_epi32(_mm_setr_epi16(
            left[base_y_c[0] + 1], left[base_y_c[1] + 1], left[base_y_c[2] + 1],
            left[base_y_c[3] + 1], left[base_y_c[4] + 1], left[base_y_c[5] + 1],
            left[base_y_c[6] + 1], left[base_y_c[7] + 1]));

        shift = _mm256_srli_epi32(_mm256_and_si256(y_c256, c3f), 1);

        diff = _mm256_sub_epi32(a1_y, a0_y);  // a[x+1] - a[x]
        a32 = _mm256_slli_epi32(a0_y, 5);     // a[x] * 32
        a32 = _mm256_add_epi32(a32, a16);     // a[x] * 32 + 16

        b = _mm256_mullo_epi32(diff, shift);
        res = _mm256_add_epi32(a32, b);
        res = _mm256_srli_epi32(res, 5);

        resy[0] = _mm256_packus_epi32(
            res, _mm256_castsi128_si256(_mm256_extracti128_si256(res, 1)));

        a0_y = _mm256_cvtepu16_epi32(_mm_setr_epi16(
            left[base_y_c[8]], left[base_y_c[9]], left[base_y_c[10]],
            left[base_y_c[11]], left[base_y_c[12]], left[base_y_c[13]],
            left[base_y_c[14]], left[base_y_c[15]]));
        a1_y = _mm256_cvtepu16_epi32(
            _mm_setr_epi16(left[base_y_c[8] + 1], left[base_y_c[9] + 1],
                           left[base_y_c[10] + 1], left[base_y_c[11] + 1],
                           left[base_y_c[12] + 1], left[base_y_c[13] + 1],
                           left[base_y_c[14] + 1], left[base_y_c[15] + 1]));
        shift = _mm256_srli_epi32(_mm256_and_si256(y_c_1_256, c3f), 1);

        diff = _mm256_sub_epi32(a1_y, a0_y);  // a[x+1] - a[x]
        a32 = _mm256_slli_epi32(a0_y, 5);     // a[x] * 32
        a32 = _mm256_add_epi32(a32, a16);     // a[x] * 32 + 16

        b = _mm256_mullo_epi32(diff, shift);
        res = _mm256_add_epi32(a32, b);
        res = _mm256_srli_epi32(res, 5);

        resy[1] = _mm256_packus_epi32(
            res, _mm256_castsi128_si256(_mm256_extracti128_si256(res, 1)));

        resy[0] =
            _mm256_inserti128_si256(resy[0], _mm256_castsi256_si128(resy[1]),
                                    1);  // 16 16bit values
      }

      resxy = _mm256_blendv_epi8(resx[0], resy[0],
                                 *(__m256i *)HighbdBaseMask[base_min_diff]);
      _mm256_storeu_si256((__m256i *)(dst + j), resxy);
    }  // for j
    dst += stride;
  }
}